

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetPropertyCommand.cxx
# Opt level: O2

bool __thiscall
cmSetPropertyCommand::InitialPass
          (cmSetPropertyCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  bool bVar1;
  undefined1 uVar2;
  ostream *poVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string local_1e0;
  string *local_1c0;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_1b8;
  string *local_1b0;
  ostringstream e;
  
  __lhs = (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)__lhs) < 0x21) {
    std::__cxx11::string::string
              ((string *)&e,"called with incorrect number of arguments",(allocator *)&local_1e0);
    cmCommand::SetError(&this->super_cmCommand,(string *)&e);
  }
  else {
    bVar1 = std::operator==(__lhs,"GLOBAL");
    uVar4 = 3;
    if ((!bVar1) && (bVar1 = std::operator==(__lhs,"DIRECTORY"), uVar4 = 2, !bVar1)) {
      bVar1 = std::operator==(__lhs,"TARGET");
      uVar4 = 0;
      if (!bVar1) {
        bVar1 = std::operator==(__lhs,"SOURCE");
        uVar4 = 1;
        if (!bVar1) {
          bVar1 = std::operator==(__lhs,"TEST");
          if (bVar1) {
            uVar4 = 5;
          }
          else {
            bVar1 = std::operator==(__lhs,"CACHE");
            if (bVar1) {
              uVar4 = 4;
            }
            else {
              bVar1 = std::operator==(__lhs,"INSTALL");
              if (!bVar1) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
                poVar3 = std::operator<<((ostream *)&e,"given invalid scope ");
                poVar3 = std::operator<<(poVar3,(string *)__lhs);
                poVar3 = std::operator<<(poVar3,".  ");
                std::operator<<(poVar3,
                                "Valid scopes are GLOBAL, DIRECTORY, TARGET, SOURCE, TEST, CACHE, INSTALL."
                               );
                std::__cxx11::stringbuf::str();
                cmCommand::SetError(&this->super_cmCommand,&local_1e0);
                std::__cxx11::string::~string((string *)&local_1e0);
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
                return false;
              }
              uVar4 = 8;
            }
          }
        }
      }
    }
    local_1c0 = &this->PropertyValue;
    local_1b0 = &this->PropertyName;
    local_1b8 = &this->Names;
    uVar6 = 1;
    while (__lhs = __lhs + 1,
          __lhs != (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish) {
      bVar1 = std::operator==(__lhs,"PROPERTY");
      uVar5 = 2;
      if (!bVar1) {
        bVar1 = std::operator==(__lhs,"APPEND");
        if (bVar1) {
          this->Remove = false;
          this->AppendMode = true;
          this->AppendAsString = false;
        }
        else {
          bVar1 = std::operator==(__lhs,"APPEND_STRING");
          if (!bVar1) {
            uVar2 = (*(code *)(&DAT_0049999c + *(int *)(&DAT_0049999c + uVar6 * 4)))();
            return (bool)uVar2;
          }
          this->Remove = false;
          this->AppendMode = true;
          this->AppendAsString = true;
        }
        uVar5 = 0;
      }
      uVar6 = (ulong)uVar5;
    }
    if ((this->PropertyName)._M_string_length != 0) {
      switch(uVar4) {
      case 0:
        bVar1 = HandleTargetMode(this);
        return bVar1;
      case 1:
        bVar1 = HandleSourceMode(this);
        return bVar1;
      case 2:
        bVar1 = HandleDirectoryMode(this);
        return bVar1;
      case 3:
        bVar1 = HandleGlobalMode(this);
        return bVar1;
      case 4:
        bVar1 = HandleCacheMode(this);
        return bVar1;
      case 5:
        bVar1 = HandleTestMode(this);
        return bVar1;
      default:
        return true;
      case 8:
        bVar1 = HandleInstallMode(this);
        return bVar1;
      }
    }
    std::__cxx11::string::string
              ((string *)&e,"not given a PROPERTY <name> argument.",(allocator *)&local_1e0);
    cmCommand::SetError(&this->super_cmCommand,(string *)&e);
  }
  std::__cxx11::string::~string((string *)&e);
  return false;
}

Assistant:

bool cmSetPropertyCommand
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  if(args.size() < 2 )
    {
    this->SetError("called with incorrect number of arguments");
    return false;
    }

  // Get the scope on which to set the property.
  std::vector<std::string>::const_iterator arg = args.begin();
  cmProperty::ScopeType scope;
  if(*arg == "GLOBAL")
    {
    scope = cmProperty::GLOBAL;
    }
  else if(*arg == "DIRECTORY")
    {
    scope = cmProperty::DIRECTORY;
    }
  else if(*arg == "TARGET")
    {
    scope = cmProperty::TARGET;
    }
  else if(*arg == "SOURCE")
    {
    scope = cmProperty::SOURCE_FILE;
    }
  else if(*arg == "TEST")
    {
    scope = cmProperty::TEST;
    }
  else if(*arg == "CACHE")
    {
    scope = cmProperty::CACHE;
    }
  else if(*arg == "INSTALL")
    {
    scope = cmProperty::INSTALL;
    }
  else
    {
    std::ostringstream e;
    e << "given invalid scope " << *arg << ".  "
      << "Valid scopes are GLOBAL, DIRECTORY, "
        "TARGET, SOURCE, TEST, CACHE, INSTALL.";
    this->SetError(e.str());
    return false;
    }

  // Parse the rest of the arguments up to the values.
  enum Doing { DoingNone, DoingNames, DoingProperty, DoingValues };
  Doing doing = DoingNames;
  const char* sep = "";
  for(++arg; arg != args.end(); ++arg)
    {
    if(*arg == "PROPERTY")
      {
      doing = DoingProperty;
      }
    else if(*arg == "APPEND")
      {
      doing = DoingNone;
      this->AppendMode = true;
      this->Remove = false;
      this->AppendAsString = false;
      }
    else if(*arg == "APPEND_STRING")
      {
      doing = DoingNone;
      this->AppendMode = true;
      this->Remove = false;
      this->AppendAsString = true;
      }
    else if(doing == DoingNames)
      {
      this->Names.insert(*arg);
      }
    else if(doing == DoingProperty)
      {
      this->PropertyName = *arg;
      doing = DoingValues;
      }
    else if(doing == DoingValues)
      {
      this->PropertyValue += sep;
      sep = ";";
      this->PropertyValue += *arg;
      this->Remove = false;
      }
    else
      {
      std::ostringstream e;
      e << "given invalid argument \"" << *arg << "\".";
      this->SetError(e.str());
      return false;
      }
    }

  // Make sure a property name was found.
  if(this->PropertyName.empty())
    {
    this->SetError("not given a PROPERTY <name> argument.");
    return false;
    }

  // Dispatch property setting.
  switch(scope)
    {
    case cmProperty::GLOBAL:      return this->HandleGlobalMode();
    case cmProperty::DIRECTORY:   return this->HandleDirectoryMode();
    case cmProperty::TARGET:      return this->HandleTargetMode();
    case cmProperty::SOURCE_FILE: return this->HandleSourceMode();
    case cmProperty::TEST:        return this->HandleTestMode();
    case cmProperty::CACHE:       return this->HandleCacheMode();
    case cmProperty::INSTALL:     return this->HandleInstallMode();

    case cmProperty::VARIABLE:
    case cmProperty::CACHED_VARIABLE:
      break; // should never happen
    }
  return true;
}